

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint32 ma_dr_mp3_decode_next_frame_ex(ma_dr_mp3 *pMP3,ma_dr_mp3d_sample_t *pPCMFrames)

{
  size_t szNew;
  size_t *psVar1;
  int iVar2;
  uint uVar3;
  ma_uint8 *pmVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  ma_dr_mp3dec_frame_info local_3c;
  
  pmVar4 = (pMP3->memory).pData;
  if ((pmVar4 == (ma_uint8 *)0x0) || (sVar5 = (pMP3->memory).dataSize, sVar5 == 0)) {
    uVar3 = 0;
    if ((pMP3->field_0x3ea0 & 1) == 0) {
      while( true ) {
        uVar8 = pMP3->dataSize;
        if (uVar8 < 0x4000) {
          pmVar4 = pMP3->pData;
          if (pmVar4 == (ma_uint8 *)0x0) {
            pmVar4 = (ma_uint8 *)0x0;
          }
          else {
            memmove(pmVar4,pmVar4 + pMP3->dataConsumed,uVar8);
            pmVar4 = pMP3->pData;
          }
          pMP3->dataConsumed = 0;
          uVar8 = pMP3->dataCapacity;
          if (uVar8 < 0x10000) {
            pmVar4 = (ma_uint8 *)
                     ma_dr_mp3__realloc_from_callbacks
                               (pmVar4,0x10000,uVar8,&pMP3->allocationCallbacks);
            if (pmVar4 == (ma_uint8 *)0x0) {
              return 0;
            }
            pMP3->pData = pmVar4;
            pMP3->dataCapacity = 0x10000;
            uVar8 = 0x10000;
          }
          sVar5 = (*pMP3->onRead)(pMP3->pUserData,pmVar4 + pMP3->dataSize,uVar8 - pMP3->dataSize);
          pMP3->streamCursor = pMP3->streamCursor + sVar5;
          if (sVar5 == 0 && pMP3->dataSize == 0) goto LAB_00173849;
          uVar8 = pMP3->dataSize + sVar5;
          pMP3->dataSize = uVar8;
        }
        if (0x7fffffff < uVar8) goto LAB_00173849;
        if (pMP3->pData == (ma_uint8 *)0x0) {
          return 0;
        }
        iVar2 = ma_dr_mp3dec_decode_frame
                          (&pMP3->decoder,pMP3->pData + pMP3->dataConsumed,(int)uVar8,pPCMFrames,
                           &local_3c);
        lVar7 = (long)local_3c.frame_bytes;
        if (0 < lVar7) {
          pMP3->dataConsumed = pMP3->dataConsumed + lVar7;
          pMP3->dataSize = pMP3->dataSize - lVar7;
        }
        if (iVar2 != 0) break;
        if (local_3c.frame_bytes == 0) {
          memmove(pMP3->pData,pMP3->pData + pMP3->dataConsumed,pMP3->dataSize);
          pMP3->dataConsumed = 0;
          sVar6 = pMP3->dataSize;
          sVar5 = pMP3->dataCapacity;
          pmVar4 = pMP3->pData;
          if (sVar5 == sVar6) {
            szNew = sVar5 + 0x10000;
            pmVar4 = (ma_uint8 *)
                     ma_dr_mp3__realloc_from_callbacks
                               (pmVar4,szNew,sVar5,&pMP3->allocationCallbacks);
            if (pmVar4 == (ma_uint8 *)0x0) {
              return 0;
            }
            pMP3->pData = pmVar4;
            pMP3->dataCapacity = szNew;
            sVar6 = pMP3->dataSize;
            sVar5 = szNew;
          }
          sVar5 = (*pMP3->onRead)(pMP3->pUserData,pmVar4 + sVar6,sVar5 - sVar6);
          pMP3->streamCursor = pMP3->streamCursor + sVar5;
          if (sVar5 == 0) {
LAB_00173849:
            pMP3->field_0x3ea0 = pMP3->field_0x3ea0 | 1;
            return 0;
          }
          pMP3->dataSize = pMP3->dataSize + sVar5;
        }
      }
      uVar3 = ma_dr_mp3_hdr_frame_samples((pMP3->decoder).header);
      pMP3->pcmFramesConsumedInMP3Frame = 0;
      pMP3->pcmFramesRemainingInMP3Frame = uVar3;
      pMP3->mp3FrameChannels = local_3c.channels;
      pMP3->mp3FrameSampleRate = local_3c.hz;
    }
  }
  else {
    uVar3 = 0;
    if ((pMP3->field_0x3ea0 & 1) == 0) {
      sVar6 = (pMP3->memory).currentReadPos;
      while (iVar2 = ma_dr_mp3dec_decode_frame
                               (&pMP3->decoder,pmVar4 + sVar6,(int)sVar5 - (int)sVar6,pPCMFrames,
                                &local_3c), iVar2 == 0) {
        if ((long)local_3c.frame_bytes < 1) {
          uVar3 = 0;
          goto LAB_00173881;
        }
        sVar6 = (long)local_3c.frame_bytes + (pMP3->memory).currentReadPos;
        (pMP3->memory).currentReadPos = sVar6;
        pmVar4 = (pMP3->memory).pData;
        sVar5 = (pMP3->memory).dataSize;
      }
      uVar3 = ma_dr_mp3_hdr_frame_samples((pMP3->decoder).header);
      pMP3->pcmFramesConsumedInMP3Frame = 0;
      pMP3->pcmFramesRemainingInMP3Frame = uVar3;
      pMP3->mp3FrameChannels = local_3c.channels;
      pMP3->mp3FrameSampleRate = local_3c.hz;
LAB_00173881:
      psVar1 = &(pMP3->memory).currentReadPos;
      *psVar1 = *psVar1 + (long)local_3c.frame_bytes;
    }
  }
  return uVar3;
}

Assistant:

static ma_uint32 ma_dr_mp3_decode_next_frame_ex(ma_dr_mp3* pMP3, ma_dr_mp3d_sample_t* pPCMFrames)
{
    if (pMP3->memory.pData != NULL && pMP3->memory.dataSize > 0) {
        return ma_dr_mp3_decode_next_frame_ex__memory(pMP3, pPCMFrames);
    } else {
        return ma_dr_mp3_decode_next_frame_ex__callbacks(pMP3, pPCMFrames);
    }
}